

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O3

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,unsigned_short i)

{
  undefined6 in_register_00000032;
  uint __len;
  string __str;
  long *local_48;
  undefined8 local_40;
  long local_38 [2];
  
  __len = 1;
  if ((9 < i) && (__len = 2, 99 < i)) {
    __len = 3;
    if (999 < i) {
      __len = 5 - (i < 10000);
    }
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_48,__len,(uint)CONCAT62(in_register_00000032,i));
  (*this->_vptr_Pipeline[2])(this,local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(unsigned short i)
{
    this->writeString(std::to_string(i));
    return *this;
}